

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O2

void bb_max_clq(void)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  _Elt_pointer pbVar7;
  Vset *pVVar8;
  _WordT *p_Var9;
  ulong uVar10;
  size_t __position;
  _Elt_pointer this_00;
  ulong uVar11;
  byte bVar12;
  _WordT a_Stack_1da8 [236];
  void *local_1648;
  void *local_1640;
  bb_content local_1638;
  Vset *this;
  
  bVar12 = 0;
  bVar2 = KDefectiveMADEC::TimeIsUp(controller);
  if (bVar2) {
    std::deque<bb_content,_std::allocator<bb_content>_>::pop_back(&bb_stack.c);
    return;
  }
  if (bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    this_00 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1];
    pbVar7 = this_00 + 1;
  }
  else {
    this_00 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur + -1;
    pbVar7 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  }
  this = &pbVar7[-1].C;
  TREE_SIZE = TREE_SIZE + 1;
  sVar3 = std::_Base_bitset<235UL>::_M_do_count(&this->super__Base_bitset<235UL>);
  uVar11 = 0xffffffffffffffff;
  if (-1 < (long)(sVar3 << 0x20)) {
    uVar11 = (sVar3 << 0x20) >> 0x1e;
  }
  pvVar4 = operator_new__(uVar11);
  pvVar5 = operator_new__(uVar11);
  pVVar8 = this;
  p_Var9 = a_Stack_1da8;
  for (lVar6 = 0xeb; lVar6 != 0; lVar6 = lVar6 + -1) {
    *p_Var9 = (pVVar8->super__Base_bitset<235UL>)._M_w[0];
    pVVar8 = (Vset *)((long)pVVar8 + (ulong)bVar12 * -0x10 + 8);
    p_Var9 = p_Var9 + (ulong)bVar12 * -2 + 1;
  }
  local_1648 = pvVar4;
  local_1640 = pvVar5;
  bb_color(pvVar4,pvVar5);
  for (uVar11 = sVar3 & 0xffffffff; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
    iVar1 = *(int *)((long)local_1640 + uVar11 * 4 + -4);
    sVar3 = std::_Base_bitset<235UL>::_M_do_count((_Base_bitset<235UL> *)this_00);
    if (sVar3 + (long)iVar1 <= (ulong)(long)LB) break;
    pbVar7 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pbVar7 = bb_stack.c.super__Deque_base<bb_content,_std::allocator<bb_content>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    pVVar8 = &pbVar7[-1].nC;
    memcpy(pVVar8,this,0x758);
    __position = (size_t)*(int *)((long)local_1648 + uVar11 * 4 + -4);
    std::bitset<15000UL>::set(&this_00->P,__position,true);
    std::_Base_bitset<235UL>::_M_do_and
              (&pVVar8->super__Base_bitset<235UL>,&N[__position].super__Base_bitset<235UL>);
    uVar10 = (ulong)LB;
    sVar3 = std::_Base_bitset<235UL>::_M_do_count((_Base_bitset<235UL> *)this_00);
    if (uVar10 < sVar3) {
      sVar3 = std::_Base_bitset<235UL>::_M_do_count((_Base_bitset<235UL> *)this_00);
      LB = (int)sVar3;
      fprintf(_stderr,"new LB: %d @ MAX CLIQUE\n",sVar3 & 0xffffffff);
    }
    bVar2 = std::_Base_bitset<235UL>::_M_is_any(&pVVar8->super__Base_bitset<235UL>);
    if (bVar2) {
      memcpy(&local_1638,this_00,0x758);
      memcpy(&local_1638.C,pVVar8,0x758);
      memset(&local_1638.nC,0,0x758);
      std::deque<bb_content,_std::allocator<bb_content>_>::emplace_back<bb_content>
                (&bb_stack.c,&local_1638);
      bb_max_clq();
    }
    std::bitset<15000UL>::reset(&this_00->P,__position);
    std::bitset<15000UL>::reset(this,__position);
  }
  operator_delete__(local_1648);
  operator_delete__(local_1640);
  std::deque<bb_content,_std::allocator<bb_content>_>::pop_back(&bb_stack.c);
  return;
}

Assistant:

void bb_max_clq() {
    if (controller -> TimeIsUp()) {
        bb_stack.pop();
        return;
    };
    Vset &P = bb_stack.top().P;
    Vset &C = bb_stack.top().C;

    ++TREE_SIZE;
    int sizeC = C.count();
    int *U = new int[sizeC];
    int *color = new int[sizeC];
    bb_color(C, U, color);
    for (int i = sizeC - 1; i >= 0; --i) {
        if (color[i] + P.count() <= LB) goto bb_finish;
        Vset &nC = bb_stack.top().nC;
        nC = C;
        int v = U[i];
        P.set(v); nC &= N[v];
        if (LB < P.count()) {
            LB = P.count();
            fprintf(stderr, "new LB: %d @ MAX CLIQUE\n", LB);
        }
        if (nC.any()) {
            bb_stack.push({P, nC, Vset()});
            bb_max_clq();
        }
        P.reset(v); C.reset(v);
    }

bb_finish:
    delete[] U;
    delete[] color;
    bb_stack.pop();
}